

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

timespec __thiscall lrit::TimeStampHeader::getUnix(TimeStampHeader *this)

{
  uint uVar1;
  uint uVar2;
  runtime_error *this_00;
  ushort uVar3;
  ulong uVar4;
  int *in_R9;
  timespec tVar5;
  char local_3c [4];
  string local_38;
  
  uVar3 = *(ushort *)(this->ccsds + 1);
  uVar2 = *(uint *)(this->ccsds + 3);
  if (uVar2 == 0 && uVar3 == 0) {
    uVar4 = 0;
    uVar2 = 0;
  }
  else {
    uVar3 = uVar3 << 8 | uVar3 >> 8;
    if (uVar3 < 0x111f) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_3c[0] = '/';
      local_3c[1] = '\0';
      local_3c[2] = '\0';
      local_3c[3] = '\0';
      util::str<char[53],char[90],char[2],int>
                (&local_38,(util *)"Assertion `days >= ccsdsToUnixDaysOffset` failed at ",
                 (char (*) [53])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/lrit.cc"
                 ,(char (*) [90])":",(char (*) [2])local_3c,in_R9);
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = uVar1 / 1000 + (uint)uVar3 * 0x15180 + 0xe96da180;
    uVar4 = (ulong)((uVar1 % 1000) * 1000000);
  }
  tVar5.tv_sec = (ulong)uVar2;
  tVar5.tv_nsec = uVar4;
  return tVar5;
}

Assistant:

struct timespec TimeStampHeader::getUnix() const {
  struct timespec ts{0, 0};
  uint16_t days = __builtin_bswap16(*reinterpret_cast<const uint16_t*>(&ccsds[1]));
  uint32_t millis = __builtin_bswap32(*reinterpret_cast<const uint32_t*>(&ccsds[3]));
  if (days > 0 || millis > 0) {
    ASSERT(days >= ccsdsToUnixDaysOffset);
    ts.tv_sec = ((days - ccsdsToUnixDaysOffset) * 24 * 60 * 60) + (millis / 1000);
    ts.tv_nsec = (millis % 1000) * 1000 * 1000;
  }
  return ts;
}